

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions_4_3_core.cpp
# Opt level: O0

void __thiscall
QOpenGLFunctions_4_3_Core::~QOpenGLFunctions_4_3_Core(QOpenGLFunctions_4_3_Core *this)

{
  undefined8 *in_RDI;
  QAbstractOpenGLFunctions *unaff_retaddr;
  
  *in_RDI = &PTR__QOpenGLFunctions_4_3_Core_00214d10;
  if (in_RDI[2] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c357e);
  }
  if (in_RDI[3] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c359c);
  }
  if (in_RDI[4] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c35ba);
  }
  if (in_RDI[5] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c35d8);
  }
  if (in_RDI[6] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c35f6);
  }
  if (in_RDI[7] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c3614);
  }
  if (in_RDI[8] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c3632);
  }
  if (in_RDI[9] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c3650);
  }
  if (in_RDI[10] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c366e);
  }
  if (in_RDI[0xb] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c368c);
  }
  if (in_RDI[0xc] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c36aa);
  }
  if (in_RDI[0xd] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c36c8);
  }
  if (in_RDI[0xe] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c36e6);
  }
  if (in_RDI[0xf] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c3704);
  }
  if (in_RDI[0x10] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c3728);
  }
  if (in_RDI[0x11] != 0) {
    QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x1c374c);
  }
  QAbstractOpenGLFunctions::~QAbstractOpenGLFunctions(unaff_retaddr);
  return;
}

Assistant:

QOpenGLFunctions_4_3_Core::~QOpenGLFunctions_4_3_Core()
{
    if (d_1_0_Core) {
        d_1_0_Core->refs.deref();
        Q_ASSERT(d_1_0_Core->refs.loadRelaxed());
    }
    if (d_1_1_Core) {
        d_1_1_Core->refs.deref();
        Q_ASSERT(d_1_1_Core->refs.loadRelaxed());
    }
    if (d_1_2_Core) {
        d_1_2_Core->refs.deref();
        Q_ASSERT(d_1_2_Core->refs.loadRelaxed());
    }
    if (d_1_3_Core) {
        d_1_3_Core->refs.deref();
        Q_ASSERT(d_1_3_Core->refs.loadRelaxed());
    }
    if (d_1_4_Core) {
        d_1_4_Core->refs.deref();
        Q_ASSERT(d_1_4_Core->refs.loadRelaxed());
    }
    if (d_1_5_Core) {
        d_1_5_Core->refs.deref();
        Q_ASSERT(d_1_5_Core->refs.loadRelaxed());
    }
    if (d_2_0_Core) {
        d_2_0_Core->refs.deref();
        Q_ASSERT(d_2_0_Core->refs.loadRelaxed());
    }
    if (d_2_1_Core) {
        d_2_1_Core->refs.deref();
        Q_ASSERT(d_2_1_Core->refs.loadRelaxed());
    }
    if (d_3_0_Core) {
        d_3_0_Core->refs.deref();
        Q_ASSERT(d_3_0_Core->refs.loadRelaxed());
    }
    if (d_3_1_Core) {
        d_3_1_Core->refs.deref();
        Q_ASSERT(d_3_1_Core->refs.loadRelaxed());
    }
    if (d_3_2_Core) {
        d_3_2_Core->refs.deref();
        Q_ASSERT(d_3_2_Core->refs.loadRelaxed());
    }
    if (d_3_3_Core) {
        d_3_3_Core->refs.deref();
        Q_ASSERT(d_3_3_Core->refs.loadRelaxed());
    }
    if (d_4_0_Core) {
        d_4_0_Core->refs.deref();
        Q_ASSERT(d_4_0_Core->refs.loadRelaxed());
    }
    if (d_4_1_Core) {
        d_4_1_Core->refs.deref();
        Q_ASSERT(d_4_1_Core->refs.loadRelaxed());
    }
    if (d_4_2_Core) {
        d_4_2_Core->refs.deref();
        Q_ASSERT(d_4_2_Core->refs.loadRelaxed());
    }
    if (d_4_3_Core) {
        d_4_3_Core->refs.deref();
        Q_ASSERT(d_4_3_Core->refs.loadRelaxed());
    }
}